

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# names.cc
# Opt level: O0

string * __thiscall
upb::generator::IncludeGuard_abi_cxx11_
          (string *__return_storage_ptr__,generator *this,string_view filename)

{
  string local_40;
  generator *pgStack_20;
  string_view filename_local;
  
  filename_local._M_len = filename._M_len;
  pgStack_20 = this;
  filename_local._M_str = (char *)__return_storage_ptr__;
  (anonymous_namespace)::ToPreproc_abi_cxx11_(&local_40,(_anonymous_namespace_ *)this,filename);
  std::operator+(__return_storage_ptr__,&local_40,"_UPB_H_");
  std::__cxx11::string::~string((string *)&local_40);
  return __return_storage_ptr__;
}

Assistant:

std::string IncludeGuard(absl::string_view filename) {
  return ToPreproc(filename) + "_UPB_H_";
}